

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

int Abc_NodeBuildCutLevelOne_int
              (Vec_Ptr_t *vVisited,Vec_Ptr_t *vLeaves,int nSizeLimit,int nFaninLimit)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  void *pvVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long *plVar12;
  
  uVar1 = vLeaves->nSize;
  if ((long)(int)uVar1 < 1) {
    uVar10 = 100;
    plVar12 = (long *)0x0;
  }
  else {
    uVar10 = 100;
    lVar11 = 0;
    plVar12 = (long *)0x0;
    do {
      plVar3 = (long *)vLeaves->pArray[lVar11];
      uVar2 = *(uint *)((long)plVar3 + 0x14);
      if ((uVar2 & 0x20) == 0) {
        __assert_fail("pNode->fMarkB == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                      ,0x82,"int Abc_NodeGetLeafCostOne(Abc_Obj_t *, int)");
      }
      uVar8 = 999;
      if (((((uVar2 & 0xf) != 2) && ((uVar2 & 0xf) != 5)) &&
          (lVar7 = *(long *)(*(long *)(*plVar3 + 0x20) + 8),
          uVar8 = (uint)((*(byte *)(*(long *)(lVar7 + (long)((int *)plVar3[4])[1] * 8) + 0x14) &
                         0x20) == 0) +
                  (uint)((*(byte *)(*(long *)(lVar7 + (long)*(int *)plVar3[4] * 8) + 0x14) & 0x20)
                        == 0), 1 < uVar8)) &&
         (uVar8 = 2, nFaninLimit < *(int *)((long)plVar3 + 0x2c))) {
        uVar8 = 999;
      }
      if ((uVar8 < uVar10) ||
         ((uVar10 == uVar8 && (*(uint *)((long)plVar12 + 0x14) >> 0xc < uVar2 >> 0xc)))) {
        plVar12 = plVar3;
        uVar10 = uVar8;
      }
      if (uVar10 == 0) {
        uVar10 = 0;
        break;
      }
      lVar11 = lVar11 + 1;
    } while ((int)uVar1 != lVar11);
  }
  if (plVar12 == (long *)0x0) {
    return 0;
  }
  if (2 < uVar10) {
    __assert_fail("CostBest < 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                  ,0x159,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if (nSizeLimit < (int)(uVar10 + uVar1 + -1)) {
    return 0;
  }
  if ((*(uint *)((long)plVar12 + 0x14) & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pFaninBest)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                  ,0x15e,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  lVar11 = (ulong)uVar1 + 1;
  do {
    if ((int)lVar11 + -1 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    lVar7 = lVar11 + -1;
    lVar5 = lVar11 + -2;
    lVar11 = lVar7;
  } while ((long *)vLeaves->pArray[lVar5] != plVar12);
  for (; (int)lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
    vLeaves->pArray[lVar7 + -1] = vLeaves->pArray[lVar7];
  }
  vLeaves->nSize = uVar1 - 1;
  pvVar4 = *(void **)(*(long *)(*(long *)(*plVar12 + 0x20) + 8) + (long)*(int *)plVar12[4] * 8);
  if ((*(uint *)((long)pvVar4 + 0x14) & 0x20) == 0) {
    *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x20;
    uVar1 = vLeaves->nCap;
    if (vLeaves->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
        }
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar1 * 2;
        if (iVar9 <= (int)uVar1) goto LAB_0029a23c;
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
        }
      }
      vLeaves->pArray = ppvVar6;
      vLeaves->nCap = iVar9;
    }
LAB_0029a23c:
    iVar9 = vLeaves->nSize;
    vLeaves->nSize = iVar9 + 1;
    vLeaves->pArray[iVar9] = pvVar4;
    uVar1 = vVisited->nCap;
    if (vVisited->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar6;
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar1 * 2;
        if (iVar9 <= (int)uVar1) goto LAB_0029a2c0;
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar6;
      }
      vVisited->nCap = iVar9;
    }
LAB_0029a2c0:
    iVar9 = vVisited->nSize;
    vVisited->nSize = iVar9 + 1;
    vVisited->pArray[iVar9] = pvVar4;
  }
  pvVar4 = *(void **)(*(long *)(*(long *)(*plVar12 + 0x20) + 8) + (long)*(int *)(plVar12[4] + 4) * 8
                     );
  if ((*(uint *)((long)pvVar4 + 0x14) & 0x20) != 0) goto LAB_0029a3fd;
  *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x20;
  uVar1 = vLeaves->nCap;
  if (vLeaves->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
      }
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_0029a362;
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
      }
    }
    vLeaves->pArray = ppvVar6;
    vLeaves->nCap = iVar9;
  }
LAB_0029a362:
  iVar9 = vLeaves->nSize;
  vLeaves->nSize = iVar9 + 1;
  vLeaves->pArray[iVar9] = pvVar4;
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_0029a3ea;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar6;
    }
    vVisited->nCap = iVar9;
  }
LAB_0029a3ea:
  iVar9 = vVisited->nSize;
  vVisited->nSize = iVar9 + 1;
  vVisited->pArray[iVar9] = pvVar4;
LAB_0029a3fd:
  if (vLeaves->nSize <= nSizeLimit) {
    return 1;
  }
  __assert_fail("vLeaves->nSize <= nSizeLimit",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                ,0x175,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

int Abc_NodeBuildCutLevelOne_int( Vec_Ptr_t * vVisited, Vec_Ptr_t * vLeaves, int nSizeLimit, int nFaninLimit )
{
    Abc_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        CostCur = Abc_NodeGetLeafCostOne( pNode, nFaninLimit );
//printf( "    Fanin %s has cost %d.\n", Abc_ObjName(pNode), CostCur );
//        if ( CostBest > CostCur ) // performance improvement: expand the variable with the smallest level
        if ( CostBest > CostCur ||
             (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( CostBest < 3 );
    if ( vLeaves->nSize - 1 + CostBest > nSizeLimit )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( Abc_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vLeaves, pFaninBest );
//printf( "Removing fanin %s.\n", Abc_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Abc_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Abc_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( vLeaves->nSize <= nSizeLimit );
    // keep doing this
    return 1;
}